

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToFirst(DBIter *this)

{
  int iVar1;
  
  this->direction_ = kForward;
  ClearSavedValue(this);
  (*this->iter_->_vptr_Iterator[3])();
  iVar1 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar1 != '\0') {
    FindNextUserEntry(this,false,&this->saved_key_);
    return;
  }
  this->valid_ = false;
  return;
}

Assistant:

void DBIter::SeekToFirst() {
            direction_ = kForward;
            ClearSavedValue();
            iter_->SeekToFirst();
            if (iter_->Valid()) {
                FindNextUserEntry(false, &saved_key_ /* temporary storage */);
            } else {
                valid_ = false;
            }
        }